

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void bc_trie_foreach_node
               (bc_trie_node_t *node,bc_string_t *str,bc_trie_foreach_func_t func,void *user_data)

{
  bc_string_t *pbVar1;
  bc_string_t *child;
  void *user_data_local;
  bc_trie_foreach_func_t func_local;
  bc_string_t *str_local;
  bc_trie_node_t *node_local;
  
  if (((node != (bc_trie_node_t *)0x0) && (str != (bc_string_t *)0x0)) &&
     (func != (bc_trie_foreach_func_t)0x0)) {
    if (node->key == '\0') {
      (*func)(str->str,node->data,user_data);
    }
    if (node->child != (_bc_trie_node_t *)0x0) {
      pbVar1 = bc_string_dup(str);
      pbVar1 = bc_string_append_c(pbVar1,node->key);
      bc_trie_foreach_node(node->child,pbVar1,func,user_data);
      bc_string_free(pbVar1,true);
    }
    if (node->next != (_bc_trie_node_t *)0x0) {
      bc_trie_foreach_node(node->next,str,func,user_data);
    }
  }
  return;
}

Assistant:

static void
bc_trie_foreach_node(bc_trie_node_t *node, bc_string_t *str,
    bc_trie_foreach_func_t func, void *user_data)
{
    if (node == NULL || str == NULL || func == NULL)
        return;

    if (node->key == '\0')
        func(str->str, node->data, user_data);

    if (node->child != NULL) {
        bc_string_t *child = bc_string_dup(str);
        child = bc_string_append_c(child, node->key);
        bc_trie_foreach_node(node->child, child, func, user_data);
        bc_string_free(child, true);
    }

    if (node->next != NULL)
        bc_trie_foreach_node(node->next, str, func, user_data);
}